

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

FIELD * Next_Field_On_Page(FIELD *field)

{
  formnode *pfVar1;
  FIELD **ppFVar2;
  FIELD *pFVar3;
  FIELD **ppFVar4;
  bool bVar5;
  
  pfVar1 = field->form;
  ppFVar2 = pfVar1->field;
  ppFVar4 = ppFVar2 + field->index;
  do {
    bVar5 = ppFVar4 == ppFVar2 + pfVar1->page[pfVar1->curpage].pmax;
    ppFVar4 = ppFVar4 + 1;
    if (bVar5) {
      ppFVar4 = ppFVar2 + pfVar1->page[pfVar1->curpage].pmin;
    }
    pFVar3 = *ppFVar4;
  } while ((pFVar3 != field) && ((pFVar3->opts & 3U) != 3));
  return pFVar3;
}

Assistant:

INLINE static FIELD *Next_Field_On_Page(FIELD * field)
{
  FORM  *form = field->form;
  FIELD **field_on_page = &form->field[field->index];
  FIELD **first_on_page = &form->field[form->page[form->curpage].pmin];
  FIELD **last_on_page  = &form->field[form->page[form->curpage].pmax];

  do
    {
      field_on_page = 
        (field_on_page==last_on_page) ? first_on_page : field_on_page + 1;
      if (Field_Is_Selectable(*field_on_page))
        break;
    } while(field!=(*field_on_page));  
  return(*field_on_page);
}